

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_buffer.h
# Opt level: O0

cio_error cio_read_buffer_init(cio_read_buffer *read_buffer,void *data,size_t size)

{
  bool bVar1;
  size_t size_local;
  void *data_local;
  cio_read_buffer *read_buffer_local;
  
  bVar1 = true;
  if ((read_buffer != (cio_read_buffer *)0x0) && (bVar1 = true, data != (void *)0x0)) {
    bVar1 = size == 0;
  }
  if (bVar1) {
    read_buffer_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    read_buffer->data = (uint8_t *)data;
    read_buffer->end = (uint8_t *)((long)data + size);
    read_buffer->fetch_ptr = (uint8_t *)data;
    read_buffer->add_ptr = (uint8_t *)data;
    read_buffer_local._4_4_ = CIO_SUCCESS;
  }
  return read_buffer_local._4_4_;
}

Assistant:

static inline enum cio_error cio_read_buffer_init(struct cio_read_buffer *read_buffer, void *data, size_t size)
{
	if (cio_unlikely((read_buffer == NULL) || (data == NULL) || (size == 0))) {
		return CIO_INVALID_ARGUMENT;
	}

	read_buffer->data = data;
	read_buffer->end = (uint8_t *)data + size;
	read_buffer->fetch_ptr = data;
	read_buffer->add_ptr = data;

	return CIO_SUCCESS;
}